

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::_::
CopyConstructArray_<capnp::_::RpcSystemBase::RpcConnectionState::Question,_capnp::_::RpcSystemBase::RpcConnectionState::Question_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  uint *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Question *pQVar4;
  Question *pQVar5;
  Question *pQVar6;
  
  pQVar5 = this->start;
  pQVar6 = this->pos;
  if (pQVar5 < pQVar6) {
    do {
      pQVar4 = pQVar6 + -1;
      this->pos = pQVar4;
      puVar1 = pQVar6[-1].paramExports.ptr;
      if (puVar1 != (uint *)0x0) {
        sVar2 = pQVar6[-1].paramExports.size_;
        (pQVar4->paramExports).ptr = (uint *)0x0;
        pQVar6[-1].paramExports.size_ = 0;
        pAVar3 = pQVar6[-1].paramExports.disposer;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,4,sVar2,sVar2,0);
        pQVar5 = this->start;
        pQVar4 = this->pos;
      }
      pQVar6 = pQVar4;
    } while (pQVar5 < pQVar6);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }